

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

bool __thiscall slang::parsing::Preprocessor::isDefined(Preprocessor *this,string_view name)

{
  undefined1 local_19;
  
  if (name._M_len == 0) {
    local_19 = 0;
  }
  else {
    isDefined();
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool Preprocessor::isDefined(std::string_view name) {
    return !name.empty() && macros.find(name) != macros.end();
}